

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.cpp
# Opt level: O2

void __thiscall ANNkd_tree::~ANNkd_tree(ANNkd_tree *this)

{
  (this->super_ANNpointSet)._vptr_ANNpointSet = (_func_int **)&PTR__ANNkd_tree_0010aca8;
  if (this->root != (ANNkd_ptr)0x0) {
    (*this->root->_vptr_ANNkd_node[1])();
  }
  if (this->pidx != (ANNidxArray)0x0) {
    operator_delete__(this->pidx);
  }
  if (this->bnd_box_lo != (ANNpoint)0x0) {
    annDeallocPt(&this->bnd_box_lo);
  }
  if (this->bnd_box_hi != (ANNpoint)0x0) {
    annDeallocPt(&this->bnd_box_hi);
  }
  if (this->Topology != (int *)0x0) {
    operator_delete__(this->Topology);
  }
  if (this->Scale != (double *)0x0) {
    operator_delete__(this->Scale);
    return;
  }
  return;
}

Assistant:

ANNkd_tree::~ANNkd_tree()  // tree destructor
{
    if (root != NULL) delete root;
    if (pidx != NULL) delete[] pidx;
    if (bnd_box_lo != NULL) annDeallocPt(bnd_box_lo);
    if (bnd_box_hi != NULL) annDeallocPt(bnd_box_hi);
    if (Topology != NULL) delete[] Topology;
    if (Scale != NULL) delete[] Scale;
}